

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O0

void __thiscall TestOutput::printFailure(TestOutput *this,TestFailure *failure)

{
  bool bVar1;
  TestFailure *in_RSI;
  TestFailure *in_RDI;
  TestOutput *unaff_retaddr;
  TestFailure *in_stack_00000018;
  TestOutput *in_stack_00000020;
  TestOutput *in_stack_ffffffffffffffd0;
  TestFailure *failure_00;
  
  failure_00 = in_RDI;
  bVar1 = TestFailure::isOutsideTestFile((TestFailure *)0x17d342);
  if (!bVar1) {
    bVar1 = TestFailure::isInHelperFunction(in_RSI);
    if (!bVar1) {
      printFileAndLineForFailure(unaff_retaddr,failure_00);
      goto LAB_0017d376;
    }
  }
  printFileAndLineForTestAndFailure(in_stack_00000020,in_stack_00000018);
LAB_0017d376:
  (*in_RSI->_vptr_TestFailure[6])();
  printFailureMessage(in_stack_ffffffffffffffd0,(SimpleString *)in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x17d3a9);
  return;
}

Assistant:

void TestOutput::printFailure(const TestFailure& failure)
{
    if (failure.isOutsideTestFile() || failure.isInHelperFunction())
        printFileAndLineForTestAndFailure(failure);
    else
        printFileAndLineForFailure(failure);

    printFailureMessage(failure.getMessage());
}